

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput.cpp
# Opt level: O1

error<idx2::err_code> idx2::WriteBuffer(cstr FileName,buffer *Buf)

{
  int *piVar1;
  int iVar2;
  undefined8 in_RAX;
  FILE *__s;
  size_t sVar3;
  name_map *pnVar4;
  err_code eVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  long *in_FS_OFFSET;
  error<idx2::err_code> eVar10;
  undefined4 uVar11;
  
  uVar11 = (undefined4)((ulong)in_RAX >> 0x20);
  __s = fopen(FileName,"wb");
  if (__s == (FILE *)0x0) {
    *(char **)(*in_FS_OFFSET + -0x780) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x880) = 0x32;
    pnVar4 = &err_code_s::NameMap;
    eVar5 = err_code_s::NameMap.Arr[0].ItemVal;
    if (err_code_s::NameMap.Arr[0].ItemVal != FileCreateFailed) {
      lVar7 = 0;
      do {
        if (lVar7 == 0x1e0) {
          eVar5 = __Invalid__;
          goto LAB_00186275;
        }
        piVar1 = (int *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar7);
        lVar7 = lVar7 + 0x18;
      } while (*piVar1 != 10);
      eVar5 = FileCreateFailed;
    }
LAB_00186275:
    if (err_code_s::NameMap.Arr[0].ItemVal != eVar5) {
      lVar7 = 0;
      do {
        lVar6 = lVar7;
        if (lVar6 == 0x1e0) goto LAB_001863f2;
        lVar7 = lVar6 + 0x18;
      } while (*(err_code *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar6) != eVar5);
      pnVar4 = (name_map *)((long)&err_code_s::NameMap.Arr[1].Name.field_0 + lVar6);
    }
    lVar7 = *in_FS_OFFSET;
    iVar2 = snprintf((char *)(lVar7 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                     (ulong)(uint)pnVar4->Arr[0].Name.Size,pnVar4->Arr[0].Name.field_0.Ptr,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                     ,CONCAT44(uVar11,0x32));
    pcVar9 = "%s";
    snprintf((char *)(lVar7 + -0xc80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
    uVar8 = 0x1000000000a;
  }
  else {
    sVar3 = fwrite(Buf->Data,Buf->Bytes,1,__s);
    lVar7 = *in_FS_OFFSET;
    *(char **)(*in_FS_OFFSET + -0x780) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
    ;
    if (sVar3 == 1) {
      *(undefined4 *)(lVar7 + -0x880) = 0x37;
      pcVar9 = "";
      uVar8 = 0;
    }
    else {
      *(undefined4 *)(lVar7 + -0x880) = 0x36;
      pnVar4 = &err_code_s::NameMap;
      eVar5 = err_code_s::NameMap.Arr[0].ItemVal;
      if (err_code_s::NameMap.Arr[0].ItemVal != FileWriteFailed) {
        lVar7 = 0;
        do {
          if (lVar7 == 0x1e0) {
            eVar5 = __Invalid__;
            goto LAB_00186321;
          }
          piVar1 = (int *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar7);
          lVar7 = lVar7 + 0x18;
        } while (*piVar1 != 0xc);
        eVar5 = FileWriteFailed;
      }
LAB_00186321:
      if (err_code_s::NameMap.Arr[0].ItemVal != eVar5) {
        lVar7 = 0;
        do {
          lVar6 = lVar7;
          if (lVar6 == 0x1e0) {
LAB_001863f2:
            __assert_fail("It != End(EnumS.NameMap)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/ErrorCodes.h"
                          ,0xc,"stref idx2::ToString(err_code)");
          }
          lVar7 = lVar6 + 0x18;
        } while (*(err_code *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar6) != eVar5);
        pnVar4 = (name_map *)((long)&err_code_s::NameMap.Arr[1].Name.field_0 + lVar6);
      }
      lVar7 = *in_FS_OFFSET;
      iVar2 = snprintf((char *)(lVar7 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                       (ulong)(uint)pnVar4->Arr[0].Name.Size,pnVar4->Arr[0].Name.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                       ,CONCAT44(uVar11,0x36));
      pcVar9 = "%s";
      snprintf((char *)(lVar7 + -0xc80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
      uVar8 = 0x1000000000c;
    }
  }
  if (__s != (FILE *)0x0) {
    fclose(__s);
  }
  eVar10.Code = (int)uVar8;
  eVar10.StackIdx = (char)((ulong)uVar8 >> 0x20);
  eVar10.StrGened = (bool)(char)((ulong)uVar8 >> 0x28);
  eVar10._14_2_ = (short)((ulong)uVar8 >> 0x30);
  eVar10.Msg = pcVar9;
  return eVar10;
}

Assistant:

error<>
WriteBuffer(cstr FileName, const buffer& Buf)
{
  idx2_Assert(Buf.Data && Buf.Bytes);

  FILE* Fp = fopen(FileName, "wb");
  idx2_CleanUp(if (Fp) fclose(Fp));
  if (!Fp)
    return idx2_Error(err_code::FileCreateFailed, "%s", FileName);

  /* Read file contents */
  if (fwrite(Buf.Data, size_t(Buf.Bytes), 1, Fp) != 1)
    return idx2_Error(err_code::FileWriteFailed, "%s", FileName);
  return idx2_Error(err_code::NoError);
}